

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void __thiscall
CodeGenGenericContext::KillLateUnreadRegVmRegisters
          (CodeGenGenericContext *this,uchar *instRegKillInfo)

{
  byte bVar1;
  long lVar2;
  x86Argument local_50;
  
  bVar1 = *instRegKillInfo;
  if ((bVar1 != 0) && ((bVar1 & 0xf) != 0)) {
    lVar2 = 0;
    do {
      local_50.ptrNum = (uint)instRegKillInfo[lVar2 + (ulong)(bVar1 >> 4) + 1] << 3;
      local_50.type = argPtr;
      local_50.field_1.reg = rEDX;
      local_50.ptrBase = rEBX;
      local_50.ptrIndex = rNONE;
      local_50.ptrMult = 1;
      MemKillDeadStore(this,&local_50);
      lVar2 = lVar2 + 1;
    } while ((bVar1 & 0xf) != (uint)lVar2);
  }
  return;
}

Assistant:

void CodeGenGenericContext::KillLateUnreadRegVmRegisters(unsigned char *instRegKillInfo)
{
	if(unsigned regKillCounts = *instRegKillInfo)
	{
		instRegKillInfo++;

		unsigned preKillCount = (regKillCounts >> 4);
		unsigned postKillCount = (regKillCounts & 0xf);

		instRegKillInfo += preKillCount;

		for(unsigned k = 0; k < postKillCount; k++)
			KillUnreadRegVmRegister(*instRegKillInfo++);
	}
}